

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.h
# Opt level: O0

CreateSignatureHashTxInRequest * __thiscall
cfd::js::api::json::CreateSignatureHashTxInRequest::GetSighashTypeString_abi_cxx11_
          (CreateSignatureHashTxInRequest *this,CreateSignatureHashTxInRequest *obj)

{
  CreateSignatureHashTxInRequest *obj_local;
  
  core::ConvertToString<std::__cxx11::string>((core *)this,&obj->sighash_type_);
  return this;
}

Assistant:

static std::string GetSighashTypeString(  // line separate
      const CreateSignatureHashTxInRequest& obj) {  // NOLINT
    return cfd::core::ConvertToString(obj.sighash_type_);
  }